

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.cpp
# Opt level: O0

void __thiscall ot::commissioner::Job::Wait(Job *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  format_args args;
  string local_1c8;
  string local_1a8;
  string local_188;
  anon_class_1_0_00000001 local_162;
  v10 local_161;
  v10 *local_160;
  char *local_158;
  string local_150;
  allocator local_119;
  string local_118;
  undefined1 local_f1;
  Job *pJStack_f0;
  bool condition;
  Job *this_local;
  undefined1 local_b0 [16];
  v10 *local_a0;
  char *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  string *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  Job **local_38;
  undefined1 *local_30;
  Job **local_28;
  Job **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  pJStack_f0 = this;
  local_f1 = std::thread::joinable(&this->mJobThread);
  if ((bool)local_f1) {
    std::thread::join();
    bVar1 = Interpreter::Value::HasNoError(&this->mValue);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_118,"job",&local_119);
      Wait::anon_class_1_0_00000001::operator()(&local_162);
      local_58 = &local_160;
      local_60 = &local_161;
      bVar2 = ::fmt::v10::operator()(local_60);
      local_158 = (char *)bVar2.size_;
      local_160 = (v10 *)bVar2.data_;
      ::fmt::v10::detail::
      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                ();
      utils::Hex<unsigned_long>(&local_188,this->mXpanId);
      GetCommandString_abi_cxx11_(&local_1a8,this);
      Interpreter::Value::ToString_abi_cxx11_(&local_1c8,&this->mValue);
      local_68 = &local_150;
      local_78 = local_160;
      pcStack_70 = local_158;
      local_80 = &local_188;
      local_88 = &local_1a8;
      local_90 = &local_1c8;
      local_50 = &local_78;
      local_a0 = local_160;
      local_98 = local_158;
      local_48 = local_a0;
      pcStack_40 = local_98;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this_local,(v10 *)local_80,local_88,local_90,in_R8);
      local_30 = local_b0;
      local_38 = &this_local;
      local_18 = 0xddd;
      fmt.size_ = 0xddd;
      fmt.data_ = local_98;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_38;
      local_28 = local_38;
      local_20 = local_38;
      local_10 = local_30;
      ::fmt::v10::vformat_abi_cxx11_(&local_150,local_a0,fmt,args);
      Log(kDebug,&local_118,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
    }
    return;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job.cpp"
                ,0x35,"void ot::commissioner::Job::Wait()");
}

Assistant:

void Job::Wait()
{
    ASSERT(mJobThread.joinable());
    mJobThread.join();
    if (!mValue.HasNoError())
    {
        LOG_DEBUG(LOG_REGION_JOB, "{}: job '{}' failed: {}", utils::Hex(mXpanId), GetCommandString(),
                  mValue.ToString());
    }
}